

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O0

bool DirectiveRelativeInclude(ArgumentList *List,int flags)

{
  bool bVar1;
  size_t sVar2;
  Entry *pEVar3;
  int flags_local;
  ArgumentList *List_local;
  
  sVar2 = ArgumentList::size(List);
  if (sVar2 == 1) {
    pEVar3 = ArgumentList::operator[](List,0);
    bVar1 = std::operator==(&pEVar3->text,L"on");
    if (bVar1) {
      Global.relativeInclude = true;
    }
    else {
      pEVar3 = ArgumentList::operator[](List,0);
      bVar1 = std::operator==(&pEVar3->text,L"off");
      if (!bVar1) {
        Logger::printError<>(Error,L"Invalid arguments");
        return false;
      }
      Global.relativeInclude = false;
    }
  }
  else {
    Global.relativeInclude = true;
  }
  return true;
}

Assistant:

bool DirectiveRelativeInclude(ArgumentList& List, int flags)
{
	if (List.size() == 1)
	{
		if (List[0].text == L"on")
		{
			Global.relativeInclude = true;
		} else if (List[0].text == L"off")
		{
			Global.relativeInclude = false;
		} else {
			Logger::printError(Logger::Error,L"Invalid arguments");
			return false;
		}
	} else {
		Global.relativeInclude = true;
	}
	return true;
}